

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O2

void CreateBackwardReferencesNH55
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  ulong *puVar3;
  PreparedDictionary *pPVar4;
  long lVar5;
  long lVar6;
  size_t sVar7;
  PreparedDictionary *pPVar8;
  uint uVar9;
  ushort uVar10;
  uint32_t *puVar11;
  short sVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  PreparedDictionary *pPVar16;
  ulong *puVar17;
  ulong *puVar18;
  PreparedDictionary *pPVar19;
  undefined1 *puVar20;
  byte bVar21;
  PreparedDictionary *pPVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  PreparedDictionary *pPVar26;
  uint uVar27;
  int iVar28;
  ulong uVar29;
  PreparedDictionary *pPVar30;
  ulong uVar31;
  PreparedDictionary *pPVar32;
  char cVar33;
  undefined1 *puVar34;
  uint8_t uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  PreparedDictionary *local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  PreparedDictionary *local_f8;
  size_t *local_d8;
  int local_bc;
  ulong auStack_58 [5];
  
  pPVar16 = (PreparedDictionary *)((1L << (literal_context_lut[8] & 0x3f)) - 0x10);
  pPVar4 = (PreparedDictionary *)((position - 7) + num_bytes);
  pPVar22 = (PreparedDictionary *)position;
  if (7 < num_bytes) {
    pPVar22 = pPVar4;
  }
  lVar23 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    lVar23 = 0x40;
  }
  puVar2 = (undefined1 *)(position + num_bytes);
  lVar5 = *(long *)(literal_context_lut + 0x10);
  uVar37 = *(ulong *)dist_cache;
  pPVar30 = (PreparedDictionary *)(lVar23 + position);
  lVar6 = *(long *)(literal_context_lut + 0x60);
  uVar9 = (uint)ringbuffer_mask;
  local_d8 = last_insert_len;
  do {
LAB_00e1598c:
    pPVar32 = (PreparedDictionary *)position;
    if (puVar2 <= &pPVar32->source_size) {
      *(undefined1 **)dist_cache = puVar2 + (uVar37 - (long)pPVar32);
      *(long *)commands = *(long *)commands + ((long)local_d8 - (long)last_insert_len >> 4);
      return;
    }
    local_108 = (long)puVar2 - (long)pPVar32;
    pPVar19 = pPVar16;
    if (pPVar32 < pPVar16) {
      pPVar19 = pPVar32;
    }
    uVar39 = (ulong)pPVar32 & ringbuffer_mask;
    puVar3 = (ulong *)(ringbuffer + uVar39);
    uVar35 = ringbuffer[uVar39];
    local_f8 = (PreparedDictionary *)(long)*(int *)(hasher->common).extra;
    local_110 = 0x7e4;
    if (((PreparedDictionary *)((long)pPVar32 - (long)local_f8) < pPVar32) &&
       (uVar13 = (uint)(PreparedDictionary *)((long)pPVar32 - (long)local_f8) & uVar9,
       uVar35 == ringbuffer[uVar13])) {
      puVar17 = (ulong *)(ringbuffer + uVar13);
      lVar24 = 0;
      puVar18 = puVar3;
      uVar31 = local_108;
LAB_00e15a0c:
      if (uVar31 < 8) {
        for (uVar36 = 0;
            (uVar31 != uVar36 &&
            (*(char *)((long)puVar17 + uVar36) == *(char *)((long)puVar18 + uVar36)));
            uVar36 = uVar36 + 1) {
        }
      }
      else {
        if (*puVar18 == *puVar17) break;
        uVar36 = *puVar17 ^ *puVar18;
        uVar31 = 0;
        if (uVar36 != 0) {
          for (; (uVar36 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
          }
        }
        uVar36 = uVar31 >> 3 & 0x1fffffff;
      }
      uVar36 = uVar36 - lVar24;
      if ((uVar36 < 4) || (uVar31 = uVar36 * 0x87 + 0x78f, uVar31 < 0x7e5)) goto LAB_00e15a7b;
      uVar35 = *(uint8_t *)((long)puVar3 + uVar36);
      local_110 = uVar31;
    }
    else {
LAB_00e15a7b:
      local_f8 = (PreparedDictionary *)0x0;
      uVar36 = 0;
    }
    sVar7 = (params->dictionary).compound.num_chunks;
    lVar24 = *(long *)(ringbuffer + uVar39);
    for (lVar25 = 0; lVar25 != 0x20; lVar25 = lVar25 + 8) {
      *(ulong *)((long)auStack_58 + lVar25) =
           (ulong)((uint)((ulong)(lVar24 * -0x1ca5842ca8642d00) >> 0x2c) + (int)lVar25 & 0xfffff);
    }
    uVar13 = (uint)pPVar32;
    for (lVar24 = 0; lVar24 != 4; lVar24 = lVar24 + 1) {
      uVar27 = *(uint *)(sVar7 + auStack_58[lVar24] * 4);
      puVar18 = (ulong *)(ringbuffer + (uVar9 & uVar27));
      if (((uVar35 == *(uint8_t *)(uVar36 + (long)puVar18)) &&
          (pPVar32 != (PreparedDictionary *)(ulong)uVar27)) &&
         (pPVar26 = (PreparedDictionary *)((long)pPVar32 - (long)(ulong)uVar27), pPVar26 <= pPVar19)
         ) {
        lVar25 = 0;
        puVar17 = puVar3;
        uVar39 = local_108;
LAB_00e15b29:
        if (uVar39 < 8) {
          for (uVar31 = 0;
              (uVar39 != uVar31 &&
              (*(char *)((long)puVar18 + uVar31) == *(char *)((long)puVar17 + uVar31)));
              uVar31 = uVar31 + 1) {
          }
        }
        else {
          if (*puVar17 == *puVar18) goto code_r0x00e15b3b;
          uVar31 = *puVar18 ^ *puVar17;
          uVar39 = 0;
          if (uVar31 != 0) {
            for (; (uVar31 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
            }
          }
          uVar31 = uVar39 >> 3 & 0x1fffffff;
        }
        uVar31 = uVar31 - lVar25;
        if (3 < uVar31) {
          iVar28 = 0x1f;
          if ((uint)pPVar26 != 0) {
            for (; (uint)pPVar26 >> iVar28 == 0; iVar28 = iVar28 + -1) {
            }
          }
          uVar39 = (ulong)(iVar28 * -0x1e + 0x780) + uVar31 * 0x87;
          if (local_110 < uVar39) {
            uVar35 = *(uint8_t *)((long)puVar3 + uVar31);
            uVar36 = uVar31;
            local_110 = uVar39;
            local_f8 = pPVar26;
          }
        }
      }
    }
    *(uint *)(sVar7 + *(long *)((long)auStack_58 + (ulong)(uVar13 & 0x18)) * 4) = uVar13;
    if (0x1f < local_108 && ((ulong)pPVar32 & 3) == 0) {
      for (pPVar26 = (params->dictionary).compound.chunks[1]; pPVar26 <= pPVar32;
          pPVar26 = (PreparedDictionary *)&pPVar26->num_items) {
        uVar27 = (uint)(params->dictionary).compound.total_size;
        uVar14 = uVar27 & 0x3fffffff;
        *(uint *)&(params->dictionary).compound.total_size =
             uVar27 * *(int *)((long)(params->dictionary).compound.chunks + 0x14) +
             (uint)ringbuffer[(ulong)&pPVar26[1].source_size & ringbuffer_mask] +
             ~(uint)ringbuffer[(ulong)pPVar26 & ringbuffer_mask] *
             *(int *)((params->dictionary).compound.chunks + 3) + 1;
        if (uVar14 < 0x1000000) {
          pPVar8 = (params->dictionary).compound.chunks[0];
          uVar27 = (&pPVar8->magic)[uVar14];
          (&pPVar8->magic)[uVar14] = (uint32_t)pPVar26;
          if ((pPVar26 == pPVar32) && (uVar27 != 0xffffffff)) {
            uVar14 = uVar13 - uVar27;
            if ((PreparedDictionary *)(ulong)uVar14 <= pPVar19) {
              puVar17 = (ulong *)(ringbuffer + (uVar27 & uVar9));
              lVar24 = 0;
              uVar39 = local_108;
              puVar18 = puVar3;
LAB_00e15c5a:
              if (uVar39 < 8) {
                for (uVar31 = 0;
                    (uVar39 != uVar31 &&
                    (*(char *)((long)puVar17 + uVar31) == *(char *)((long)puVar18 + uVar31)));
                    uVar31 = uVar31 + 1) {
                }
              }
              else {
                if (*puVar18 == *puVar17) goto code_r0x00e15c6b;
                uVar31 = *puVar17 ^ *puVar18;
                uVar39 = 0;
                if (uVar31 != 0) {
                  for (; (uVar31 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                  }
                }
                uVar31 = uVar39 >> 3 & 0x1fffffff;
              }
              uVar31 = uVar31 - lVar24;
              if ((3 < uVar31) && (uVar36 < uVar31)) {
                iVar28 = 0x1f;
                if (uVar14 != 0) {
                  for (; uVar14 >> iVar28 == 0; iVar28 = iVar28 + -1) {
                  }
                }
                uVar39 = (ulong)(iVar28 * -0x1e + 0x780) + uVar31 * 0x87;
                if (local_110 < uVar39) {
                  uVar36 = uVar31;
                  local_110 = uVar39;
                  local_f8 = (PreparedDictionary *)(ulong)uVar14;
                }
              }
            }
          }
        }
      }
      (params->dictionary).compound.chunks[1] = (PreparedDictionary *)&pPVar32->num_items;
    }
    if (local_110 < 0x7e5) {
      uVar37 = uVar37 + 1;
      position = (long)&pPVar32->magic + 1;
      if (pPVar30 < position) {
        if ((PreparedDictionary *)((long)&pPVar30->magic + (ulong)(uint)((int)lVar23 * 4)) <
            position) {
          pPVar32 = (PreparedDictionary *)((long)&pPVar32->bucket_bits + 1);
          if (pPVar4 <= pPVar32) {
            pPVar32 = pPVar4;
          }
          for (; position < pPVar32; position = (size_t)&((PreparedDictionary *)position)->num_items
              ) {
            *(uint *)(sVar7 + (ulong)((uint)((ulong)(*(long *)(ringbuffer +
                                                              (position & ringbuffer_mask)) *
                                                    -0x1ca5842ca8642d00) >> 0x2c) +
                                      ((uint)position & 0x18) & 0xfffff) * 4) = (uint)position;
            uVar37 = uVar37 + 4;
          }
        }
        else {
          pPVar32 = (PreparedDictionary *)((long)&pPVar32->source_size + 1);
          if (pPVar4 <= pPVar32) {
            pPVar32 = pPVar4;
          }
          for (; position < pPVar32; position = (long)&((PreparedDictionary *)position)->magic + 2)
          {
            *(uint *)(sVar7 + (ulong)((uint)((ulong)(*(long *)(ringbuffer +
                                                              (position & ringbuffer_mask)) *
                                                    -0x1ca5842ca8642d00) >> 0x2c) +
                                      ((uint)position & 0x18) & 0xfffff) * 4) = (uint)position;
            uVar37 = uVar37 + 2;
          }
        }
      }
      goto LAB_00e1598c;
    }
    local_bc = 0;
    uVar39 = uVar37;
    do {
      local_108 = local_108 - 1;
      uVar31 = uVar36 - 1;
      if (local_108 <= uVar36 - 1) {
        uVar31 = local_108;
      }
      if (4 < *(int *)(literal_context_lut + 4)) {
        uVar31 = 0;
      }
      pPVar30 = (PreparedDictionary *)((long)&pPVar32->magic + 1);
      pPVar19 = pPVar16;
      if (pPVar30 < pPVar16) {
        pPVar19 = pPVar30;
      }
      puVar3 = (ulong *)(ringbuffer + ((ulong)pPVar30 & ringbuffer_mask));
      cVar33 = *(char *)(uVar31 + (long)puVar3);
      local_118 = (PreparedDictionary *)(long)*(int *)(hasher->common).extra;
      local_100 = 0x7e4;
      if (((PreparedDictionary *)((long)pPVar30 - (long)local_118) < pPVar30) &&
         (puVar18 = (ulong *)(ringbuffer +
                             ((uint)(PreparedDictionary *)((long)pPVar30 - (long)local_118) & uVar9)
                             ), cVar33 == *(char *)(uVar31 + (long)puVar18))) {
        lVar24 = 0;
        uVar29 = local_108;
        puVar17 = puVar3;
LAB_00e15e75:
        if (uVar29 < 8) {
          for (uVar38 = 0;
              (uVar29 != uVar38 &&
              (*(char *)((long)puVar18 + uVar38) == *(char *)((long)puVar17 + uVar38)));
              uVar38 = uVar38 + 1) {
          }
          uVar38 = uVar38 - lVar24;
        }
        else {
          if (*puVar17 == *puVar18) goto code_r0x00e15e8e;
          uVar38 = *puVar18 ^ *puVar17;
          uVar29 = 0;
          if (uVar38 != 0) {
            for (; (uVar38 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
            }
          }
          uVar38 = (uVar29 >> 3 & 0x1fffffff) - lVar24;
        }
        if ((uVar38 < 4) || (uVar29 = uVar38 * 0x87 + 0x78f, uVar29 < 0x7e5)) {
          local_118 = (PreparedDictionary *)0x0;
        }
        else {
          cVar33 = *(char *)((long)puVar3 + uVar38);
          uVar31 = uVar38;
          local_100 = uVar29;
        }
      }
      else {
        local_118 = (PreparedDictionary *)0x0;
      }
      lVar24 = *(long *)(ringbuffer + ((ulong)pPVar30 & ringbuffer_mask));
      for (lVar25 = 0; lVar25 != 0x20; lVar25 = lVar25 + 8) {
        *(ulong *)((long)auStack_58 + lVar25) =
             (ulong)((uint)((ulong)(lVar24 * -0x1ca5842ca8642d00) >> 0x2c) + (int)lVar25 & 0xfffff);
      }
      uVar13 = (uint)pPVar30;
      for (lVar24 = 0; lVar24 != 4; lVar24 = lVar24 + 1) {
        uVar27 = *(uint *)(sVar7 + auStack_58[lVar24] * 4);
        puVar18 = (ulong *)(ringbuffer + (uVar9 & uVar27));
        if (((cVar33 == *(char *)(uVar31 + (long)puVar18)) &&
            (pPVar30 != (PreparedDictionary *)(ulong)uVar27)) &&
           (pPVar26 = (PreparedDictionary *)((long)pPVar30 - (long)(ulong)uVar27),
           pPVar26 <= pPVar19)) {
          lVar25 = 0;
          uVar29 = local_108;
          puVar17 = puVar3;
LAB_00e15f57:
          if (uVar29 < 8) {
            for (uVar38 = 0;
                (uVar29 != uVar38 &&
                (*(char *)((long)puVar18 + uVar38) == *(char *)((long)puVar17 + uVar38)));
                uVar38 = uVar38 + 1) {
            }
          }
          else {
            if (*puVar17 == *puVar18) goto code_r0x00e15f69;
            uVar38 = *puVar18 ^ *puVar17;
            uVar29 = 0;
            if (uVar38 != 0) {
              for (; (uVar38 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
              }
            }
            uVar38 = uVar29 >> 3 & 0x1fffffff;
          }
          uVar38 = uVar38 - lVar25;
          if (3 < uVar38) {
            iVar28 = 0x1f;
            if ((uint)pPVar26 != 0) {
              for (; (uint)pPVar26 >> iVar28 == 0; iVar28 = iVar28 + -1) {
              }
            }
            uVar29 = (ulong)(iVar28 * -0x1e + 0x780) + uVar38 * 0x87;
            if (local_100 < uVar29) {
              cVar33 = *(char *)((long)puVar3 + uVar38);
              uVar31 = uVar38;
              local_118 = pPVar26;
              local_100 = uVar29;
            }
          }
        }
      }
      *(uint *)(sVar7 + *(long *)((long)auStack_58 + (ulong)(uVar13 & 0x18)) * 4) = uVar13;
      if (0x1f < local_108 && ((ulong)pPVar30 & 3) == 0) {
        for (pPVar26 = (params->dictionary).compound.chunks[1]; pPVar26 <= pPVar30;
            pPVar26 = (PreparedDictionary *)&pPVar26->num_items) {
          uVar27 = (uint)(params->dictionary).compound.total_size;
          uVar14 = uVar27 & 0x3fffffff;
          *(uint *)&(params->dictionary).compound.total_size =
               uVar27 * *(int *)((long)(params->dictionary).compound.chunks + 0x14) +
               (uint)ringbuffer[(ulong)&pPVar26[1].source_size & ringbuffer_mask] +
               ~(uint)ringbuffer[(ulong)pPVar26 & ringbuffer_mask] *
               *(int *)((params->dictionary).compound.chunks + 3) + 1;
          if (uVar14 < 0x1000000) {
            pPVar8 = (params->dictionary).compound.chunks[0];
            uVar27 = (&pPVar8->magic)[uVar14];
            (&pPVar8->magic)[uVar14] = (uint32_t)pPVar26;
            if ((pPVar26 == pPVar30) && (uVar27 != 0xffffffff)) {
              uVar14 = uVar13 - uVar27;
              if ((PreparedDictionary *)(ulong)uVar14 <= pPVar19) {
                puVar17 = (ulong *)(ringbuffer + (uVar27 & uVar9));
                lVar24 = 0;
                uVar29 = local_108;
                puVar18 = puVar3;
LAB_00e160c5:
                if (uVar29 < 8) {
                  for (uVar38 = 0;
                      (uVar29 != uVar38 &&
                      (*(char *)((long)puVar17 + uVar38) == *(char *)((long)puVar18 + uVar38)));
                      uVar38 = uVar38 + 1) {
                  }
                }
                else {
                  if (*puVar18 == *puVar17) goto code_r0x00e160d6;
                  uVar38 = *puVar17 ^ *puVar18;
                  uVar29 = 0;
                  if (uVar38 != 0) {
                    for (; (uVar38 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                    }
                  }
                  uVar38 = uVar29 >> 3 & 0x1fffffff;
                }
                uVar38 = uVar38 - lVar24;
                if ((3 < uVar38) && (uVar31 < uVar38)) {
                  iVar28 = 0x1f;
                  if (uVar14 != 0) {
                    for (; uVar14 >> iVar28 == 0; iVar28 = iVar28 + -1) {
                    }
                  }
                  uVar29 = (ulong)(iVar28 * -0x1e + 0x780) + uVar38 * 0x87;
                  if (local_100 < uVar29) {
                    uVar31 = uVar38;
                    local_118 = (PreparedDictionary *)(ulong)uVar14;
                    local_100 = uVar29;
                  }
                }
              }
            }
          }
        }
        (params->dictionary).compound.chunks[1] =
             (PreparedDictionary *)((long)&pPVar32->num_items + 1);
      }
      uVar29 = uVar39;
      pPVar19 = pPVar32;
      if ((local_100 < local_110 + 0xaf) ||
         (local_f8 = local_118, uVar29 = uVar37 + 4, pPVar19 = pPVar30, uVar36 = uVar31,
         local_bc == 3)) break;
      uVar29 = uVar39 + 1;
      local_bc = local_bc + 1;
      puVar11 = &pPVar32->source_size;
      local_110 = local_100;
      pPVar32 = pPVar30;
      uVar39 = uVar29;
    } while ((undefined1 *)((long)puVar11 + 1U) < puVar2);
    pPVar30 = (PreparedDictionary *)((long)&pPVar19->magic + lVar5);
    if (pPVar16 <= pPVar30) {
      pPVar30 = pPVar16;
    }
    pPVar30 = (PreparedDictionary *)((long)&pPVar30->magic + lVar6);
    if (pPVar30 < local_f8) {
LAB_00e1625f:
      puVar34 = (undefined1 *)((long)&local_f8->hash_bits + 3);
LAB_00e16263:
      if ((local_f8 <= pPVar30) && (puVar34 != (undefined1 *)0x0)) {
        *(undefined4 *)((long)(hasher->common).extra + 0xc) =
             *(undefined4 *)((hasher->common).extra + 1);
        *(void **)((long)(hasher->common).extra + 4) = (hasher->common).extra[0];
        *(int *)(hasher->common).extra = (int)local_f8;
      }
    }
    else {
      pPVar32 = (PreparedDictionary *)(long)*(int *)(hasher->common).extra;
      if (local_f8 != pPVar32) {
        pPVar26 = (PreparedDictionary *)(long)*(int *)((long)(hasher->common).extra + 4);
        puVar34 = (undefined1 *)0x1;
        if (local_f8 != pPVar26) {
          uVar37 = (long)local_f8 + (3 - (long)pPVar32);
          if (uVar37 < 7) {
            bVar21 = (byte)((int)uVar37 << 2);
            uVar13 = 0x9750468;
          }
          else {
            uVar37 = (long)local_f8 + (3 - (long)pPVar26);
            if (6 < uVar37) {
              puVar34 = (undefined1 *)0x2;
              if ((local_f8 != (PreparedDictionary *)(long)*(int *)((hasher->common).extra + 1)) &&
                 (puVar34 = (undefined1 *)0x3,
                 local_f8 !=
                 (PreparedDictionary *)(long)*(int *)((long)(hasher->common).extra + 0xc)))
              goto LAB_00e1625f;
              goto LAB_00e16263;
            }
            bVar21 = (byte)((int)uVar37 << 2);
            uVar13 = 0xfdb1ace;
          }
          puVar34 = (undefined1 *)(ulong)(uVar13 >> (bVar21 & 0x1f) & 0xf);
        }
        goto LAB_00e16263;
      }
      puVar34 = (undefined1 *)0x0;
    }
    uVar27 = (uint)uVar29;
    *(uint *)local_d8 = uVar27;
    uVar14 = (uint)uVar36;
    *(uint *)((long)local_d8 + 4) = uVar14;
    puVar1 = (undefined1 *)((ulong)*(uint *)(literal_context_lut + 0x3c) + 0x10);
    uVar13 = 0;
    if (puVar1 <= puVar34) {
      bVar21 = (byte)*(uint *)(literal_context_lut + 0x38);
      puVar20 = puVar34 + ((4L << (bVar21 & 0x3f)) - (ulong)*(uint *)(literal_context_lut + 0x3c)) +
                          -0x10;
      uVar13 = 0x1f;
      uVar15 = (uint)puVar20;
      if (uVar15 != 0) {
        for (; uVar15 >> uVar13 == 0; uVar13 = uVar13 - 1) {
        }
      }
      uVar13 = (uVar13 ^ 0xffffffe0) + 0x1f;
      uVar37 = (ulong)(((ulong)puVar20 >> ((ulong)uVar13 & 0x3f) & 1) != 0);
      lVar24 = (ulong)uVar13 - (ulong)*(uint *)(literal_context_lut + 0x38);
      puVar34 = (undefined1 *)
                ((ulong)(puVar1 + (uVar37 + lVar24 * 2 + 0xfffe << (bVar21 & 0x3f)) +
                                  (ulong)(~(-1 << (bVar21 & 0x1f)) & uVar15)) | lVar24 * 0x400);
      uVar13 = (uint)((long)puVar20 - (uVar37 + 2 << ((byte)uVar13 & 0x3f)) >> (bVar21 & 0x3f));
    }
    *(short *)((long)local_d8 + 0xe) = (short)puVar34;
    *(uint *)(local_d8 + 1) = uVar13;
    if (5 < uVar29) {
      if (uVar29 < 0x82) {
        uVar13 = 0x1f;
        uVar27 = (uint)(uVar29 - 2);
        if (uVar27 != 0) {
          for (; uVar27 >> uVar13 == 0; uVar13 = uVar13 - 1) {
          }
        }
        uVar27 = (int)(uVar29 - 2 >> ((char)(uVar13 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                 (uVar13 ^ 0xffffffe0) * 2 + 0x40;
      }
      else if (uVar29 < 0x842) {
        uVar13 = 0x1f;
        if (uVar27 - 0x42 != 0) {
          for (; uVar27 - 0x42 >> uVar13 == 0; uVar13 = uVar13 - 1) {
          }
        }
        uVar27 = (uVar13 ^ 0xffe0) + 0x2a;
      }
      else {
        uVar27 = 0x15;
        if (0x1841 < uVar29) {
          uVar27 = (uint)(ushort)(0x17 - (uVar29 < 0x5842));
        }
      }
    }
    uVar37 = (ulong)(int)uVar14;
    if (uVar37 < 10) {
      uVar13 = uVar14 - 2;
    }
    else if (uVar37 < 0x86) {
      uVar13 = 0x1f;
      uVar14 = (uint)(uVar37 - 6);
      if (uVar14 != 0) {
        for (; uVar14 >> uVar13 == 0; uVar13 = uVar13 - 1) {
        }
      }
      uVar13 = (int)(uVar37 - 6 >> ((char)(uVar13 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar13 ^ 0xffffffe0) * 2 + 0x42;
    }
    else {
      uVar13 = 0x17;
      if (uVar37 < 0x846) {
        uVar13 = 0x1f;
        if (uVar14 - 0x46 != 0) {
          for (; uVar14 - 0x46 >> uVar13 == 0; uVar13 = uVar13 - 1) {
          }
        }
        uVar13 = (uVar13 ^ 0xffe0) + 0x2c;
      }
    }
    uVar10 = (ushort)uVar13;
    sVar12 = (uVar10 & 7) + ((ushort)uVar27 & 7) * 8;
    if (((((ulong)puVar34 & 0x3ff) == 0) && ((ushort)uVar27 < 8)) && (uVar10 < 0x10)) {
      if (7 < uVar10) {
        sVar12 = sVar12 + 0x40;
      }
    }
    else {
      iVar28 = ((uVar27 & 0xffff) >> 3) * 3 + ((uVar13 & 0xffff) >> 3);
      sVar12 = sVar12 + ((ushort)(0x520d40 >> ((char)iVar28 * '\x02' & 0x1fU)) & 0xc0) +
                        (short)iVar28 * 0x40 + 0x40;
    }
    *(short *)((long)local_d8 + 0xc) = sVar12;
    *num_commands = *num_commands + uVar29;
    position = (long)&pPVar19->magic + uVar36;
    pPVar32 = pPVar22;
    if (position < pPVar22) {
      pPVar32 = (PreparedDictionary *)position;
    }
    pPVar26 = (PreparedDictionary *)((long)&pPVar19->magic + 2);
    if (local_f8 < (PreparedDictionary *)(uVar36 >> 2)) {
      pPVar30 = (PreparedDictionary *)(position + (long)local_f8 * -4);
      if (pPVar30 < pPVar26) {
        pPVar30 = pPVar26;
      }
      pPVar26 = pPVar30;
      if (pPVar32 < pPVar30) {
        pPVar26 = pPVar32;
      }
    }
    pPVar30 = (PreparedDictionary *)((long)&pPVar19->magic + uVar36 * 2 + lVar23);
    local_d8 = local_d8 + 2;
    for (; pPVar26 < pPVar32; pPVar26 = (PreparedDictionary *)((long)&pPVar26->magic + 1)) {
      *(uint *)(sVar7 + (ulong)((uint)((ulong)(*(long *)(ringbuffer +
                                                        ((ulong)pPVar26 & ringbuffer_mask)) *
                                              -0x1ca5842ca8642d00) >> 0x2c) + ((uint)pPVar26 & 0x18)
                               & 0xfffff) * 4) = (uint)pPVar26;
    }
    uVar37 = 0;
  } while( true );
  puVar18 = puVar18 + 1;
  puVar17 = puVar17 + 1;
  uVar31 = uVar31 - 8;
  lVar24 = lVar24 + -8;
  goto LAB_00e15a0c;
code_r0x00e15b3b:
  puVar17 = puVar17 + 1;
  puVar18 = puVar18 + 1;
  uVar39 = uVar39 - 8;
  lVar25 = lVar25 + -8;
  goto LAB_00e15b29;
code_r0x00e15c6b:
  puVar18 = puVar18 + 1;
  puVar17 = puVar17 + 1;
  uVar39 = uVar39 - 8;
  lVar24 = lVar24 + -8;
  goto LAB_00e15c5a;
code_r0x00e15e8e:
  puVar17 = puVar17 + 1;
  puVar18 = puVar18 + 1;
  uVar29 = uVar29 - 8;
  lVar24 = lVar24 + -8;
  goto LAB_00e15e75;
code_r0x00e15f69:
  puVar17 = puVar17 + 1;
  puVar18 = puVar18 + 1;
  uVar29 = uVar29 - 8;
  lVar25 = lVar25 + -8;
  goto LAB_00e15f57;
code_r0x00e160d6:
  puVar18 = puVar18 + 1;
  puVar17 = puVar17 + 1;
  uVar29 = uVar29 - 8;
  lVar24 = lVar24 + -8;
  goto LAB_00e160c5;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}